

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_andi_i32_riscv64
               (TCGContext_conflict11 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  TCGv_i32 arg2_00;
  TCGv_i32 t0;
  int32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  if (arg2 == -1) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg1);
  }
  else if (arg2 == 0) {
    tcg_gen_movi_i32(tcg_ctx,ret,0);
  }
  else if (arg2 == 0xff) {
    tcg_gen_op2_i32(tcg_ctx,INDEX_op_ext8u_i32,ret,arg1);
  }
  else if (arg2 == 0xffff) {
    tcg_gen_op2_i32(tcg_ctx,INDEX_op_ext16u_i32,ret,arg1);
  }
  else {
    arg2_00 = tcg_const_i32_riscv64(tcg_ctx,arg2);
    tcg_gen_and_i32(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_i32(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_andi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    TCGv_i32 t0;
    /* Some cases can be optimized here.  */
    switch (arg2) {
    case 0:
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
        return;
    case -1:
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
        return;
    case 0xff:
        /* Don't recurse with tcg_gen_ext8u_i32.  */
        if (TCG_TARGET_HAS_ext8u_i32) {
            tcg_gen_op2_i32(tcg_ctx, INDEX_op_ext8u_i32, ret, arg1);
            return;
        }
        break;
    case 0xffff:
        if (TCG_TARGET_HAS_ext16u_i32) {
            tcg_gen_op2_i32(tcg_ctx, INDEX_op_ext16u_i32, ret, arg1);
            return;
        }
        break;
    }
    t0 = tcg_const_i32(tcg_ctx, arg2);
    tcg_gen_and_i32(tcg_ctx, ret, arg1, t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}